

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

void __thiscall QHostAddress::QHostAddress(QHostAddress *this,sockaddr *sockaddr)

{
  uint uVar1;
  QHostAddressPrivate *pQVar2;
  
  pQVar2 = (QHostAddressPrivate *)operator_new(0x38);
  (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)0x0;
  (pQVar2->scopeId).d.size = 0;
  (pQVar2->scopeId).d.d = (Data *)0x0;
  (pQVar2->scopeId).d.ptr = (char16_t *)0x0;
  pQVar2->a = 0;
  pQVar2->protocol = -1;
  (pQVar2->field_1).a6_64.c[0] = 0;
  (pQVar2->field_1).a6_64.c[1] = 0;
  (this->d).d.ptr = pQVar2;
  LOCK();
  (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  if (sockaddr->sa_family == 10) {
    setAddress(this,(quint8 *)(sockaddr->sa_data + 6));
    return;
  }
  if (sockaddr->sa_family == 2) {
    uVar1 = *(uint *)(sockaddr->sa_data + 2);
    setAddress(this,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
    ;
    return;
  }
  return;
}

Assistant:

QHostAddress::QHostAddress(const struct sockaddr *sockaddr)
    : d(new QHostAddressPrivate)
{
    if (sockaddr->sa_family == AF_INET)
        setAddress(htonl(((const sockaddr_in *)sockaddr)->sin_addr.s_addr));
    else if (sockaddr->sa_family == AF_INET6)
        setAddress(((const sockaddr_in6 *)sockaddr)->sin6_addr.s6_addr);
}